

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

void xmlFreeCatalog(xmlCatalogPtr catal)

{
  _xmlCatalogEntry *p_Var1;
  xmlCatalogEntryPtr payload;
  xmlChar *in_RSI;
  
  if (catal == (xmlCatalogPtr)0x0) {
    return;
  }
  payload = catal->xml;
  while (payload != (xmlCatalogEntryPtr)0x0) {
    p_Var1 = payload->next;
    xmlFreeCatalogEntry(payload,in_RSI);
    payload = p_Var1;
  }
  if (catal->sgml != (xmlHashTablePtr)0x0) {
    xmlHashFree(catal->sgml,xmlFreeCatalogEntry);
  }
  (*xmlFree)(catal);
  return;
}

Assistant:

void
xmlFreeCatalog(xmlCatalogPtr catal) {
    if (catal == NULL)
	return;
    if (catal->xml != NULL)
	xmlFreeCatalogEntryList(catal->xml);
    if (catal->sgml != NULL)
	xmlHashFree(catal->sgml, xmlFreeCatalogEntry);
    xmlFree(catal);
}